

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::RemoveInventory(APlayerPawn *this,AInventory *item)

{
  TObjPtr<AInventory> *pTVar1;
  player_t *ppVar2;
  AInventory *pAVar3;
  
  if ((this->super_AActor).player != (player_t *)0x0) {
    pTVar1 = &this->InvSel;
    pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)pTVar1);
    if (pAVar3 == item) {
      pAVar3 = AInventory::NextInv(item);
      (pTVar1->field_0).p = pAVar3;
      pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)pTVar1);
      if (pAVar3 == (AInventory *)0x0) {
        pAVar3 = AInventory::PrevInv(item);
        (pTVar1->field_0).p = pAVar3;
      }
    }
    pTVar1 = &this->InvFirst;
    pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)pTVar1);
    if (pAVar3 == item) {
      pAVar3 = AInventory::NextInv(item);
      (pTVar1->field_0).p = pAVar3;
      pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)pTVar1);
      if (pAVar3 == (AInventory *)0x0) {
        pAVar3 = AInventory::PrevInv(item);
        (pTVar1->field_0).p = pAVar3;
      }
    }
    ppVar2 = (this->super_AActor).player;
    if (ppVar2->PendingWeapon == (AWeapon *)item) {
      ppVar2->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    }
    if (ppVar2->ReadyWeapon == (AWeapon *)item) {
      ppVar2->ReadyWeapon = (AWeapon *)0x0;
      ppVar2->refire = 0;
      AActor::RemoveInventory(&this->super_AActor,item);
      ppVar2 = (this->super_AActor).player;
      if ((ppVar2->mo == this) &&
         (ppVar2->PendingWeapon == (AWeapon *)AWeapon::RegistrationInfo.MyClass)) {
        PickNewWeapon(this,(PClassAmmo *)0x0);
        return;
      }
      return;
    }
  }
  AActor::RemoveInventory(&this->super_AActor,item);
  return;
}

Assistant:

void APlayerPawn::RemoveInventory (AInventory *item)
{
	bool pickWeap = false;

	// Since voodoo dolls aren't supposed to have an inventory, there should be
	// no need to redirect them to the real player here as there is with AddInventory.

	// If the item removed is the selected one, select something else, either the next
	// item, if there is one, or the previous item.
	if (player != NULL)
	{
		if (InvSel == item)
		{
			InvSel = item->NextInv ();
			if (InvSel == NULL)
			{
				InvSel = item->PrevInv ();
			}
		}
		if (InvFirst == item)
		{
			InvFirst = item->NextInv ();
			if (InvFirst == NULL)
			{
				InvFirst = item->PrevInv ();
			}
		}
		if (item == player->PendingWeapon)
		{
			player->PendingWeapon = WP_NOCHANGE;
		}
		if (item == player->ReadyWeapon)
		{
			// If the current weapon is removed, clear the refire counter and pick a new one.
			pickWeap = true;
			player->ReadyWeapon = NULL;
			player->refire = 0;
		}
	}
	Super::RemoveInventory (item);
	if (pickWeap && player->mo == this && player->PendingWeapon == WP_NOCHANGE)
	{
		PickNewWeapon (NULL);
	}
}